

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O0

void __thiscall
TPZFrontSym<long_double>::Print(TPZFrontSym<long_double> *this,char *name,ostream *out)

{
  ostream *poVar1;
  void *pvVar2;
  int64_t iVar3;
  long *plVar4;
  int *piVar5;
  longdouble *plVar6;
  ostream *in_RDX;
  char *in_RSI;
  long in_RDI;
  int64_t loop_limit;
  int64_t j;
  int64_t i;
  undefined2 in_stack_ffffffffffffff70;
  undefined6 in_stack_ffffffffffffff72;
  int64_t in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined6 uStack_78;
  long local_28;
  long local_20;
  
  if (in_RSI != (char *)0x0) {
    poVar1 = std::operator<<(in_RDX,in_RSI);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  poVar1 = std::operator<<(in_RDX,"Frontal Matrix Size          ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*(long *)(in_RDI + 0xa0));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDX,"Maximum Frontal Matrix Size  ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*(int *)(in_RDI + 0xc));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(in_RDX,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDX,"Local Indexation ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDX,"Position  ");
  poVar1 = std::operator<<(poVar1," Local index");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_20 = 0; iVar3 = TPZVec<long>::NElements((TPZVec<long> *)(in_RDI + 0x80)),
      local_20 < iVar3; local_20 = local_20 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<(in_RDX,local_20);
    poVar1 = std::operator<<(poVar1,"         ");
    plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x80),local_20);
    pvVar2 = (void *)std::ostream::operator<<(poVar1,*plVar4);
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  }
  std::ostream::operator<<(in_RDX,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDX,"Global Indexation ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDX,"Position  ");
  poVar1 = std::operator<<(poVar1," Global index");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_20 = 0; iVar3 = TPZVec<long>::NElements((TPZVec<long> *)(in_RDI + 0x10)),
      local_20 < iVar3; local_20 = local_20 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<(in_RDX,local_20);
    poVar1 = std::operator<<(poVar1,"            ");
    plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x10),local_20);
    pvVar2 = (void *)std::ostream::operator<<(poVar1,*plVar4);
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  }
  std::ostream::operator<<(in_RDX,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDX,"Local Freed Equatoins  ");
  iVar3 = TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0xb0));
  pvVar2 = (void *)std::ostream::operator<<(poVar1,iVar3);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDX,"position ");
  poVar1 = std::operator<<(poVar1,"Local Equation ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  iVar3 = TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0xb0));
  for (local_20 = 0; local_20 < iVar3; local_20 = local_20 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<(in_RDX,local_20);
    poVar1 = std::operator<<(poVar1,"             ");
    piVar5 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0xb0),local_20);
    pvVar2 = (void *)std::ostream::operator<<(poVar1,*piVar5);
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  }
  poVar1 = std::operator<<(in_RDX,"Frontal Matrix ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  iVar3 = TPZVec<long_double>::NElements((TPZVec<long_double> *)(in_RDI + 0xf8));
  if (0 < iVar3) {
    for (local_20 = 0; local_20 < *(long *)(in_RDI + 0xa0); local_20 = local_20 + 1) {
      for (local_28 = 0; local_28 < *(long *)(in_RDI + 0xa0); local_28 = local_28 + 1) {
        if (local_20 < local_28) {
          plVar6 = Element((TPZFrontSym<long_double> *)
                           CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                           in_stack_ffffffffffffff78,
                           CONCAT62(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70));
          in_stack_ffffffffffffff84 = SUB104(*plVar6,0);
          uStack_78 = (undefined6)((unkuint10)*plVar6 >> 0x20);
        }
        else {
          plVar6 = Element((TPZFrontSym<long_double> *)
                           CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                           in_stack_ffffffffffffff78,
                           CONCAT62(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70));
          in_stack_ffffffffffffff84 = SUB104(*plVar6,0);
          uStack_78 = (undefined6)((unkuint10)*plVar6 >> 0x20);
        }
        in_stack_ffffffffffffff70 = (undefined2)((uint6)uStack_78 >> 0x20);
        poVar1 = (ostream *)
                 std::ostream::operator<<
                           (in_RDX,(longdouble)
                                   CONCAT28(in_stack_ffffffffffffff70,
                                            (long)CONCAT64(uStack_78,in_stack_ffffffffffffff84)));
        std::operator<<(poVar1," ");
      }
      std::ostream::operator<<(in_RDX,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void TPZFrontSym<TVar>::Print(const char *name, std::ostream& out) const
{
	if(name) out << name << endl;
	int64_t i,j,loop_limit;
	
	
	out <<  "Frontal Matrix Size          "<< this->fFront << endl;
	out <<  "Maximum Frontal Matrix Size  "<< this->fMaxFront << endl;
	
	out << endl;
	out <<  "Local Indexation "<< endl;
	out <<  "Position  "<<" Local index"<< endl;
	for(i=0;i<this->fLocal.NElements();i++){
		out <<   i <<  "         "  << this->fLocal[i] << endl;
	}
	
	out << endl;
	out <<  "Global Indexation "<< endl;
	out <<  "Position  "<<" Global index"<< endl;
	
	for(i=0;i<this->fGlobal.NElements();i++){
		out <<   i <<  "            "<< this->fGlobal[i] << endl;
	}
	
	out << endl;
	out <<  "Local Freed Equatoins  "<< this->fFree.NElements() << endl;
	out <<  "position "<<   "Local Equation "<<endl;
	loop_limit=this->fFree.NElements();
	for(i=0;i<loop_limit;i++){
		out <<  i <<  "             " << this->fFree[i] << endl;
	}
	out <<  "Frontal Matrix "<< endl;
	if(this->fData.NElements() > 0) {
		for(i=0;i<this->fFront;i++){
			for(j=0;j<this->fFront;j++) out << ((i<j) ? Element(i,j) : Element(j,i)) <<  " ";
			out << endl;
		}
	}
}